

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,Assignment *a)

{
  int iVar1;
  char (*args) [2];
  Type t;
  Type local_80;
  undefined1 local_68 [16];
  RefCountedPtr<soul::Structure> local_58;
  CompileMessage local_50;
  
  ASTVisitor::visit(&this->super_ASTVisitor,a);
  iVar1 = (*(((a->target).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xf])();
  if ((char)iVar1 != '\0') {
    (*(((a->target).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])(local_68);
    local_80.boundingSize = local_68._8_4_;
    local_80.arrayElementBoundingSize = local_68._12_4_;
    local_80.structure.object = local_58.object;
    if (local_58.object != (Structure *)0x0) {
      ((local_58.object)->super_RefCountedObject).refCount =
           ((local_58.object)->super_RefCountedObject).refCount + 1;
    }
    local_80.primitiveType.type = SUB84(local_68._0_8_,4);
    local_80._0_2_ = SUB82(local_68._0_8_,0);
    local_80._2_2_ = 0;
    expectSilentCastPossible
              (&(a->super_Expression).super_Statement.super_ASTObject.context,&local_80,
               (a->newValue).object);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_80.structure);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_58);
    return;
  }
  Errors::operatorNeedsAssignableTarget<char_const(&)[2]>(&local_50,(Errors *)0x275da6,args);
  AST::Context::throwError
            (&(a->super_Expression).super_Statement.super_ASTObject.context,&local_50,false);
}

Assistant:

void visit (AST::Assignment& a) override
        {
            super::visit (a);

            if (! a.target->isAssignable())
                a.context.throwError (Errors::operatorNeedsAssignableTarget ("="));

            expectSilentCastPossible (a.context,
                                      a.target->getResultType().withConstAndRefFlags (false, false),
                                      a.newValue);
        }